

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O0

void __thiscall
dlib::matrix<float,_0L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>::
set_size(matrix<float,_0L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         *this,long rows,long cols)

{
  layout<float,_0L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_3> *plVar1;
  size_t sVar2;
  size_t in_RDX;
  layout<float,_0L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_3> *in_RSI;
  size_t in_RDI;
  
  plVar1 = (layout<float,_0L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_3> *)
           nr((matrix<float,_0L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
               *)0x296d22);
  if ((plVar1 == in_RSI) &&
     (sVar2 = nc((matrix<float,_0L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                  *)0x296d33), sVar2 == in_RDX)) {
    return;
  }
  row_major_layout::layout<float,_0L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_3>::
  set_size(in_RSI,in_RDX,in_RDI);
  return;
}

Assistant:

void set_size (
            long rows,
            long cols
        )
        {
            DLIB_ASSERT( (NR == 0 || NR == rows) && ( NC == 0 || NC == cols) &&
                    rows >= 0 && cols >= 0, 
                "\tvoid matrix::set_size(rows, cols)"
                << "\n\tYou have supplied conflicting matrix dimensions"
                << "\n\trows: " << rows
                << "\n\tcols: " << cols
                << "\n\tNR:   " << NR 
                << "\n\tNC:   " << NC 
                << "\n\tthis: " << this
                );
            if (nr() != rows || nc() != cols)
                data.set_size(rows,cols);
        }